

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O0

void __thiscall
Diligent::ShaderVariableManagerGL::ImageBindInfo::BindResource
          (ImageBindInfo *this,BindResourceInfo *BindInfo)

{
  Uint32 ArrayIndex;
  PIPELINE_RESOURCE_FLAGS PVar1;
  PipelineResourceDesc *ResDesc;
  Char *pCVar2;
  CachedResourceView *pCVar3;
  TextureViewGLImpl *BindInfo_00;
  IDeviceObject *pIVar4;
  PipelineResourceSignatureDesc *pPVar5;
  BufferViewGLImpl *pBVar6;
  char (*in_R8) [41];
  initializer_list<Diligent::BUFFER_VIEW_TYPE> ExpectedViewTypes;
  char *in_stack_fffffffffffffe80;
  Char *local_f8;
  undefined1 local_f0 [8];
  string msg_2;
  string msg_1;
  CachedResourceView *CachedUAV_1;
  RefCntAutoPtr<Diligent::BufferViewGLImpl> pViewGL_1;
  CachedResourceView *CachedUAV;
  RefCntAutoPtr<Diligent::TextureViewGLImpl> pViewGL;
  ShaderResourceCacheType *ResourceCache;
  undefined1 local_48 [8];
  string msg;
  ResourceAttribs *Attr;
  PipelineResourceDesc *Desc;
  BindResourceInfo *BindInfo_local;
  ImageBindInfo *this_local;
  
  ResDesc = ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
            ::GetDesc((ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                       *)this);
  msg.field_2._8_8_ =
       GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo>::GetAttribs
                 (&this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo>);
  if (ResDesc->ArraySize <= BindInfo->ArrayIndex) {
    FormatString<char[89]>
              ((string *)local_48,
               (char (*) [89])
               "Index is out of range, but it should\'ve been corrected by ShaderVariableBase::SetArray()"
              );
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"BindResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
               ,0x128);
    std::__cxx11::string::~string((string *)local_48);
  }
  pViewGL.m_pObject =
       (TextureViewGLImpl *)
       (((this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo>).
         super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
        .m_ParentManager)->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
       m_ResourceCache;
  if (ResDesc->ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_UAV) {
    RefCntAutoPtr<Diligent::TextureViewGLImpl>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::TextureViewGLImpl> *)&CachedUAV,
               &BindInfo->pObject->super_IObject,(INTERFACE_ID *)IID_TextureViewGL);
    pCVar3 = ShaderResourceCacheGL::GetConstImage
                       ((ShaderResourceCacheGL *)pViewGL.m_pObject,
                        *(int *)msg.field_2._8_8_ + BindInfo->ArrayIndex);
    BindInfo_00 = RefCntAutoPtr<Diligent::TextureViewGLImpl>::RawPtr
                            ((RefCntAutoPtr<Diligent::TextureViewGLImpl> *)&CachedUAV);
    pViewGL_1.m_pObject._7_1_ = 5;
    pIVar4 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr(&pCVar3->pView);
    pPVar5 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
             ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                        *)(((this->
                            super_GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo>).
                            super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                           .m_ParentManager)->
                          super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
                          m_pSignature);
    VerifyResourceViewBinding<Diligent::TextureViewGLImpl,Diligent::TEXTURE_VIEW_TYPE>
              ((Diligent *)ResDesc,(PipelineResourceDesc *)BindInfo,(BindResourceInfo *)BindInfo_00,
               (TextureViewGLImpl *)((long)&pViewGL_1.m_pObject + 7),
               (initializer_list<Diligent::TEXTURE_VIEW_TYPE>)ZEXT816(1),RESOURCE_DIM_UNDEFINED,
               SUB81(pIVar4,0),(IDeviceObject *)(pPVar5->super_DeviceObjectAttribs).Name,
               in_stack_fffffffffffffe80);
    ShaderResourceCacheGL::SetTexImage
              ((ShaderResourceCacheGL *)pViewGL.m_pObject,
               *(int *)msg.field_2._8_8_ + BindInfo->ArrayIndex,
               (RefCntAutoPtr<Diligent::TextureViewGLImpl> *)&CachedUAV);
    RefCntAutoPtr<Diligent::TextureViewGLImpl>::~RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::TextureViewGLImpl> *)&CachedUAV);
  }
  else if (ResDesc->ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV) {
    RefCntAutoPtr<Diligent::BufferViewGLImpl>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::BufferViewGLImpl> *)&CachedUAV_1,
               &BindInfo->pObject->super_IObject,(INTERFACE_ID *)IID_BufferViewGL);
    pCVar3 = ShaderResourceCacheGL::GetConstImage
                       ((ShaderResourceCacheGL *)pViewGL.m_pObject,
                        *(int *)msg.field_2._8_8_ + BindInfo->ArrayIndex);
    pBVar6 = RefCntAutoPtr<Diligent::BufferViewGLImpl>::RawPtr
                       ((RefCntAutoPtr<Diligent::BufferViewGLImpl> *)&CachedUAV_1);
    msg_1.field_2._M_local_buf[0xf] = '\x02';
    pIVar4 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr(&pCVar3->pView);
    pPVar5 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
             ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                        *)(((this->
                            super_GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo>).
                            super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                           .m_ParentManager)->
                          super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
                          m_pSignature);
    ExpectedViewTypes._M_len = 1;
    ExpectedViewTypes._M_array = (iterator)0x1;
    VerifyResourceViewBinding<Diligent::BufferViewGLImpl,Diligent::BUFFER_VIEW_TYPE>
              ((Diligent *)ResDesc,(PipelineResourceDesc *)BindInfo,(BindResourceInfo *)pBVar6,
               (BufferViewGLImpl *)((long)&msg_1.field_2 + 0xf),ExpectedViewTypes,
               RESOURCE_DIM_UNDEFINED,SUB81(pIVar4,0),
               (IDeviceObject *)(pPVar5->super_DeviceObjectAttribs).Name,in_stack_fffffffffffffe80);
    PVar1 = Diligent::operator&(ResDesc->Flags,PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER);
    if (PVar1 == PIPELINE_RESOURCE_FLAG_NONE) {
      FormatString<char[93]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (char (*) [93])
                 "FORMATTED_BUFFER resource flag is not set for an image buffer - this should\'ve not happened."
                );
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"BindResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
                 ,0x14b);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    ArrayIndex = BindInfo->ArrayIndex;
    pBVar6 = RefCntAutoPtr<Diligent::BufferViewGLImpl>::RawPtr
                       ((RefCntAutoPtr<Diligent::BufferViewGLImpl> *)&CachedUAV_1);
    ValidateBufferMode<Diligent::BufferViewGLImpl>(ResDesc,ArrayIndex,pBVar6);
    ShaderResourceCacheGL::SetBufImage
              ((ShaderResourceCacheGL *)pViewGL.m_pObject,
               *(int *)msg.field_2._8_8_ + BindInfo->ArrayIndex,
               (RefCntAutoPtr<Diligent::BufferViewGLImpl> *)&CachedUAV_1);
    RefCntAutoPtr<Diligent::BufferViewGLImpl>::~RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::BufferViewGLImpl> *)&CachedUAV_1);
  }
  else {
    local_f8 = GetShaderResourceTypeLiteralName(ResDesc->ResourceType,false);
    FormatString<char[26],char_const*,char[41]>
              ((string *)local_f0,(Diligent *)"Unexpected resource type ",(char (*) [26])&local_f8,
               (char **)". Texture UAV or buffer UAV is expected.",in_R8);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"BindResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
               ,0x153);
    std::__cxx11::string::~string((string *)local_f0);
  }
  return;
}

Assistant:

void ShaderVariableManagerGL::ImageBindInfo::BindResource(const BindResourceInfo& BindInfo)
{
    const auto& Desc = GetDesc();
    const auto& Attr = GetAttribs();

    VERIFY(BindInfo.ArrayIndex < Desc.ArraySize, "Index is out of range, but it should've been corrected by ShaderVariableBase::SetArray()");
    auto& ResourceCache = m_ParentManager.m_ResourceCache;

    if (Desc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_UAV)
    {
        // We cannot use ClassPtrCast<> here as the resource can be of wrong type
        RefCntAutoPtr<TextureViewGLImpl> pViewGL{BindInfo.pObject, IID_TextureViewGL};
#ifdef DILIGENT_DEVELOPMENT
        {
            const auto& CachedUAV = ResourceCache.GetConstImage(Attr.CacheOffset + BindInfo.ArrayIndex);
            VerifyResourceViewBinding(Desc, BindInfo, pViewGL.RawPtr(),
                                      {TEXTURE_VIEW_UNORDERED_ACCESS}, // Expected view type
                                      RESOURCE_DIM_UNDEFINED,          // Expected resource dimension - unknown at this point
                                      false,                           // IsMultisample (ignored when resource dim is unknown)
                                      CachedUAV.pView.RawPtr(),
                                      m_ParentManager.m_pSignature->GetDesc().Name);
        }
#endif
        ResourceCache.SetTexImage(Attr.CacheOffset + BindInfo.ArrayIndex, std::move(pViewGL));
    }
    else if (Desc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV)
    {
        // We cannot use ClassPtrCast<> here as the resource can be of wrong type
        RefCntAutoPtr<BufferViewGLImpl> pViewGL{BindInfo.pObject, IID_BufferViewGL};
#ifdef DILIGENT_DEVELOPMENT
        {
            const auto& CachedUAV = ResourceCache.GetConstImage(Attr.CacheOffset + BindInfo.ArrayIndex);
            VerifyResourceViewBinding(Desc, BindInfo, pViewGL.RawPtr(),
                                      {BUFFER_VIEW_UNORDERED_ACCESS}, // Expected view type
                                      RESOURCE_DIM_BUFFER,            // Expected resource dimension
                                      false,                          // IsMultisample (ignored when resource dim is buffer)
                                      CachedUAV.pView.RawPtr(),
                                      m_ParentManager.m_pSignature->GetDesc().Name);

            VERIFY((Desc.Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) != 0,
                   "FORMATTED_BUFFER resource flag is not set for an image buffer - this should've not happened.");
            ValidateBufferMode(Desc, BindInfo.ArrayIndex, pViewGL.RawPtr());
        }
#endif
        ResourceCache.SetBufImage(Attr.CacheOffset + BindInfo.ArrayIndex, std::move(pViewGL));
    }
    else
    {
        UNEXPECTED("Unexpected resource type ", GetShaderResourceTypeLiteralName(Desc.ResourceType), ". Texture UAV or buffer UAV is expected.");
    }
}